

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O0

vector<LinkedToken,_std::allocator<LinkedToken>_> * __thiscall
ResponseBase::extractLinksFromLine(ResponseBase *this,string *line)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this_00;
  ulong in_RDX;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *in_RDI;
  string link;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenEnd;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tokenBegin;
  string text;
  size_t linkEnd;
  size_t linkBegin;
  size_t textEnd;
  size_t textBegin;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *links;
  value_type *in_stack_fffffffffffffd68;
  LinkedToken *in_stack_fffffffffffffd70;
  undefined6 in_stack_fffffffffffffd78;
  char in_stack_fffffffffffffd7e;
  char in_stack_fffffffffffffd7f;
  LinkedToken *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  iterator_type in_stack_fffffffffffffd90;
  bool local_259;
  bool local_219;
  LinkedToken *_content;
  undefined1 local_1e8 [32];
  LinkedToken local_1c8 [2];
  string local_138 [32];
  string *local_118;
  undefined8 local_110;
  undefined8 local_108;
  char *local_100;
  undefined8 local_f8;
  undefined1 local_d8 [8];
  undefined1 local_d0 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  LinkedToken local_70;
  ulong local_28;
  undefined1 local_19;
  ulong local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::vector
            ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)0x1b008f);
  local_28 = std::__cxx11::string::find((char)local_18,0x5b);
  while (local_28 != 0xffffffffffffffff) {
    local_70.link.field_2._8_8_ =
         braceEnd(in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                  in_stack_fffffffffffffd7f,in_stack_fffffffffffffd7e);
    if (local_70.link.field_2._8_8_ != 0xffffffffffffffff) {
      local_70.link._0_8_ = local_70.link.field_2._8_8_ + 1;
      uVar2 = std::__cxx11::string::length();
      if (((local_70.link.field_2._8_8_ + 2 < uVar2) &&
          (pcVar3 = (char *)std::__cxx11::string::operator[](local_18), *pcVar3 == '(')) &&
         (local_70.token._32_8_ =
               braceEnd(in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
                        in_stack_fffffffffffffd7f,in_stack_fffffffffffffd7e),
         local_70.token._32_8_ != 0xffffffffffffffff)) {
        local_28 = local_28 + 1;
        local_70.link._0_8_ = local_70.link._0_8_ + 1;
        if (((local_28 <= (ulong)local_70.link.field_2._8_8_) &&
            ((ulong)local_70.link._0_8_ <= (ulong)local_70.token._32_8_)) &&
           ((ulong)local_70.link.field_2._8_8_ <= (ulong)local_70.link._0_8_)) {
          std::__cxx11::string::substr((ulong)&local_70,local_18);
          _content = &local_70;
          local_80 = std::__cxx11::string::begin();
          local_88 = std::__cxx11::string::end();
          this_00 = std::
                    find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ResponseBase::extractLinksFromLine(std::__cxx11::string_const&)const::_lambda(char)_1_>
                              (local_80,local_88);
          local_78 = this_00._M_current;
          local_98 = std::__cxx11::string::begin();
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffd70,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffd68);
          local_219 = false;
          if (bVar1) {
            local_a0 = std::__cxx11::string::end();
            local_219 = __gnu_cxx::operator!=
                                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)in_stack_fffffffffffffd70,
                                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)in_stack_fffffffffffffd68);
          }
          if (local_219 != false) {
            local_b0 = std::__cxx11::string::begin();
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd68);
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd68);
            local_c0 = std::__cxx11::string::erase(&local_70,local_a8,local_b8);
          }
          std::__cxx11::string::rbegin();
          std::__cxx11::string::rend();
          std::
          find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,ResponseBase::extractLinksFromLine(std::__cxx11::string_const&)const::_lambda(char)_2_>
                    (&local_c8,local_d0,local_d8);
          std::__cxx11::string::rbegin();
          bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffffd70,
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffffd68);
          local_259 = false;
          if (bVar1) {
            std::__cxx11::string::rend();
            local_259 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)in_stack_fffffffffffffd70,
                                        (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)in_stack_fffffffffffffd68);
          }
          if (local_259 != false) {
            in_stack_fffffffffffffd90 =
                 std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::base(&local_c8);
            local_100 = in_stack_fffffffffffffd90._M_current;
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd68);
            in_stack_fffffffffffffd80 = &local_70;
            local_110 = std::__cxx11::string::end();
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd68);
            in_stack_fffffffffffffd88 =
                 (string *)std::__cxx11::string::erase(in_stack_fffffffffffffd80,local_f8,local_108)
            ;
            local_118 = in_stack_fffffffffffffd88;
          }
          in_stack_fffffffffffffd7f = Token::isToken((string *)in_stack_fffffffffffffd90._M_current)
          ;
          if ((bool)in_stack_fffffffffffffd7f) {
            std::__cxx11::string::substr((ulong)local_138,local_18);
            in_stack_fffffffffffffd70 = (LinkedToken *)(local_1e8 + 0x20);
            std::__cxx11::string::string((string *)in_stack_fffffffffffffd70,(string *)&local_70);
            Token::Token((Token *)this_00._M_current,(string *)_content);
            in_stack_fffffffffffffd68 = (value_type *)local_1e8;
            std::__cxx11::string::string((string *)in_stack_fffffffffffffd68,local_138);
            LinkedToken::LinkedToken
                      (in_stack_fffffffffffffd80,
                       (Token *)CONCAT17(in_stack_fffffffffffffd7f,
                                         CONCAT16(in_stack_fffffffffffffd7e,
                                                  in_stack_fffffffffffffd78)),
                       (string *)in_stack_fffffffffffffd70);
            std::vector<LinkedToken,_std::allocator<LinkedToken>_>::push_back
                      ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)
                       in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
            LinkedToken::~LinkedToken(in_stack_fffffffffffffd70);
            std::__cxx11::string::~string((string *)local_1e8);
            Token::~Token((Token *)0x1b0605);
            std::__cxx11::string::~string((string *)(local_1e8 + 0x20));
            std::__cxx11::string::~string(local_138);
          }
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
    }
    local_28 = std::__cxx11::string::find((char)local_18,0x5b);
  }
  return in_RDI;
}

Assistant:

std::vector<LinkedToken> extractLinksFromLine(const std::string& line) const { // TODO needs some love
        std::vector<LinkedToken> links;

        for (size_t textBegin = line.find('['); textBegin != std::string::npos; textBegin = line.find('[', textBegin + 1)) {
            const size_t textEnd = braceEnd(line, textBegin, '[', ']');
            if (textEnd == std::string::npos) {
                continue;
            }

            size_t linkBegin = textEnd + 1;
            if ((line.length() > textEnd + 2) and (line[linkBegin] == '(')) {
                const size_t linkEnd = braceEnd(line, linkBegin, '(', ')');
                if (linkEnd == -1) {
                    continue;
                }

                textBegin++;
                linkBegin++;

                if ((textBegin > textEnd) or (linkBegin > linkEnd) or (textEnd > linkBegin)) {
                    continue;
                }

                std::string text = line.substr(textBegin, textEnd - textBegin);
                const auto tokenBegin = std::find_if(text.begin(), text.end(), [](char c) {
                    return canBePartOfIdentifier(c);
                });
                if ((tokenBegin != text.begin()) and (tokenBegin != text.end())) {
                    text.erase(text.begin(), tokenBegin);
                }

                const auto tokenEnd = std::find_if(text.rbegin(), text.rend(), [](char c) {
                    return canBePartOfIdentifier(c);
                });
                if ((tokenEnd != text.rbegin()) and (tokenEnd != text.rend())) {
                    text.erase(tokenEnd.base(), text.end());
                }

                if (Token::isToken(text)) {
                    std::string link = line.substr(linkBegin, linkEnd - linkBegin);
                    links.push_back(LinkedToken(Token(std::move(text)), std::move(link)));
                }
            }
        }

        return links;
    }